

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtw.cc
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  ostream *poVar8;
  char *pcVar9;
  int iVar10;
  ostringstream *input_stream;
  pointer ppVar11;
  char *pcVar12;
  allocator local_4b5;
  int num_order;
  DistanceMetrics local_4b0;
  DistanceMetrics local_4ac;
  string local_4a8;
  char *local_488;
  char *local_480;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> viterbi_path;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  query_vectors;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  reference_vectors;
  DynamicTimeWarping dynamic_time_warping;
  double total_score;
  vector<double,_std::allocator<double>_> tmp_2;
  ostringstream error_message;
  uint auStack_218 [122];
  
  num_order = 0x19;
  local_4ac = kNumMetrics;
  local_4b0 = kEuclidean;
  local_480 = (char *)0x0;
  local_488 = (char *)0x0;
LAB_0010362d:
  iVar6 = ya_getopt_long(argc,argv,"l:m:p:d:P:S:h",(option *)0x0,(int *)0x0);
  switch(iVar6) {
  case 0x68:
    anon_unknown.dwarf_465b::PrintUsage((ostream *)&std::cout);
    return 0;
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6e:
  case 0x6f:
switchD_00103657_caseD_69:
    anon_unknown.dwarf_465b::PrintUsage((ostream *)&std::cerr);
    return 1;
  case 0x6c:
    std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&tmp_2);
    bVar5 = sptk::ConvertStringToInteger((string *)&error_message,&num_order);
    bVar3 = num_order < 1;
    std::__cxx11::string::~string((string *)&error_message);
    if (!bVar5 || bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,
                      "The argument for the -l option must be a positive integer");
      std::__cxx11::string::string((string *)&tmp_2,"dtw",(allocator *)&dynamic_time_warping);
      sptk::PrintErrorMessage((string *)&tmp_2,&error_message);
      goto LAB_00103a9d;
    }
    num_order = num_order + -1;
    goto LAB_0010362d;
  case 0x6d:
    std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&tmp_2);
    bVar3 = sptk::ConvertStringToInteger((string *)&error_message,&num_order);
    bVar5 = num_order < 0;
    std::__cxx11::string::~string((string *)&error_message);
    if (!bVar3 || bVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      poVar8 = std::operator<<((ostream *)&error_message,"The argument for the -m option must be a "
                              );
      std::operator<<(poVar8,"non-negative integer");
      std::__cxx11::string::string((string *)&tmp_2,"dtw",(allocator *)&dynamic_time_warping);
      sptk::PrintErrorMessage((string *)&tmp_2,&error_message);
LAB_00103a9d:
      std::__cxx11::string::~string((string *)&tmp_2);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
      return 1;
    }
    goto LAB_0010362d;
  case 0x70:
    std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&tmp_2);
    bVar3 = sptk::ConvertStringToInteger((string *)&error_message,(int *)&dynamic_time_warping);
    if (bVar3) {
      bVar3 = sptk::IsInRange((DistanceMetrics)dynamic_time_warping._vptr_DynamicTimeWarping,0,6);
      std::__cxx11::string::~string((string *)&error_message);
      if (bVar3) {
        local_4ac = (DistanceMetrics)dynamic_time_warping._vptr_DynamicTimeWarping;
        goto LAB_0010362d;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&error_message);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    poVar8 = std::operator<<((ostream *)&error_message,
                             "The argument for the -p option must be an integer ");
    poVar8 = std::operator<<(poVar8,"in the range of ");
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0);
    poVar8 = std::operator<<(poVar8," to ");
    std::ostream::operator<<((ostream *)poVar8,6);
    std::__cxx11::string::string((string *)&tmp_2,"dtw",(allocator *)&local_4a8);
    sptk::PrintErrorMessage((string *)&tmp_2,&error_message);
    goto LAB_00103a9d;
  }
  if (iVar6 != -1) {
    if (iVar6 == 0x50) {
      local_480 = ya_optarg;
      goto LAB_0010362d;
    }
    if (iVar6 != 0x53) {
      if (iVar6 != 100) goto switchD_00103657_caseD_69;
      std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&tmp_2);
      bVar3 = sptk::ConvertStringToInteger((string *)&error_message,(int *)&dynamic_time_warping);
      if (bVar3) {
        bVar3 = sptk::IsInRange((DistanceMetrics)dynamic_time_warping._vptr_DynamicTimeWarping,0,3);
        std::__cxx11::string::~string((string *)&error_message);
        if (bVar3) {
          local_4b0 = (DistanceMetrics)dynamic_time_warping._vptr_DynamicTimeWarping;
          goto LAB_0010362d;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&error_message);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      poVar8 = std::operator<<((ostream *)&error_message,
                               "The argument for the -d option must be an integer ");
      poVar8 = std::operator<<(poVar8,"in the range of ");
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0);
      poVar8 = std::operator<<(poVar8," to ");
      std::ostream::operator<<((ostream *)poVar8,3);
      std::__cxx11::string::string((string *)&tmp_2,"dtw",(allocator *)&local_4a8);
      sptk::PrintErrorMessage((string *)&tmp_2,&error_message);
      goto LAB_00103a9d;
    }
    local_488 = ya_optarg;
    goto LAB_0010362d;
  }
  lVar7 = (long)argc;
  if (argc - ya_optind == 1) {
    lVar2 = lVar7 + -1;
    pcVar9 = (char *)0x0;
  }
  else {
    if (argc - ya_optind != 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,
                      "Just two input files, file1 and infile, are required");
      std::__cxx11::string::string((string *)&tmp_2,"dtw",(allocator *)&dynamic_time_warping);
      sptk::PrintErrorMessage((string *)&tmp_2,&error_message);
      goto LAB_00103a9d;
    }
    lVar2 = lVar7 + -2;
    pcVar9 = argv[lVar7 + -1];
  }
  pcVar12 = argv[lVar2];
  bVar3 = sptk::SetBinaryMode();
  if (!bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::operator<<((ostream *)&error_message,"Cannot set translation mode");
    std::__cxx11::string::string((string *)&tmp_2,"dtw",(allocator *)&dynamic_time_warping);
    sptk::PrintErrorMessage((string *)&tmp_2,&error_message);
    goto LAB_00103a9d;
  }
  lVar7 = (long)num_order;
  reference_vectors.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  reference_vectors.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  reference_vectors.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(&error_message);
  std::ifstream::open((char *)&error_message,(_Ios_Openmode)pcVar12);
  uVar1 = *(uint *)((long)auStack_218 + *(long *)(_error_message + -0x18));
  iVar6 = (int)(lVar7 + 1U);
  if ((uVar1 & 5) == 0) {
    std::vector<double,_std::allocator<double>_>::vector
              (&tmp_2,lVar7 + 1U,(allocator_type *)&dynamic_time_warping);
    while (bVar3 = sptk::ReadStream<double>
                             (false,0,0,iVar6,&tmp_2,(istream *)&error_message,(int *)0x0), bVar3) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&reference_vectors,&tmp_2);
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&tmp_2.super__Vector_base<double,_std::allocator<double>_>);
    iVar10 = 0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp_2);
    poVar8 = std::operator<<((ostream *)&tmp_2,"Cannot open file ");
    std::operator<<(poVar8,pcVar12);
    std::__cxx11::string::string((string *)&dynamic_time_warping,"dtw",(allocator *)&local_4a8);
    sptk::PrintErrorMessage((string *)&dynamic_time_warping,(ostringstream *)&tmp_2);
    std::__cxx11::string::~string((string *)&dynamic_time_warping);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp_2);
    iVar10 = 1;
  }
  std::ifstream::~ifstream(&error_message);
  if ((uVar1 & 5) != 0) goto LAB_00103fe0;
  query_vectors.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  query_vectors.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  query_vectors.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  input_stream = &error_message;
  std::ifstream::ifstream(input_stream);
  if ((pcVar9 == (char *)0x0) ||
     (std::ifstream::open((char *)&error_message,(_Ios_Openmode)pcVar9),
     (*(byte *)((long)auStack_218 + *(long *)(_error_message + -0x18)) & 5) == 0)) {
    cVar4 = std::__basic_file<char>::is_open();
    if (cVar4 == '\0') {
      input_stream = (ostringstream *)&std::cin;
    }
    std::vector<double,_std::allocator<double>_>::vector
              (&tmp_2,(long)iVar6,(allocator_type *)&dynamic_time_warping);
    while (bVar3 = sptk::ReadStream<double>
                             (false,0,0,iVar6,&tmp_2,(istream *)input_stream,(int *)0x0), bVar3) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&query_vectors,&tmp_2);
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&tmp_2.super__Vector_base<double,_std::allocator<double>_>);
    bVar3 = true;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp_2);
    poVar8 = std::operator<<((ostream *)&tmp_2,"Cannot open file ");
    std::operator<<(poVar8,pcVar9);
    std::__cxx11::string::string((string *)&dynamic_time_warping,"dtw",(allocator *)&local_4a8);
    sptk::PrintErrorMessage((string *)&dynamic_time_warping,(ostringstream *)&tmp_2);
    std::__cxx11::string::~string((string *)&dynamic_time_warping);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp_2);
    iVar10 = 1;
    bVar3 = false;
  }
  std::ifstream::~ifstream(&error_message);
  if (!bVar3) goto LAB_00103fd6;
  sptk::DynamicTimeWarping::DynamicTimeWarping(&dynamic_time_warping,num_order,local_4ac,local_4b0);
  if (dynamic_time_warping.is_valid_ != false) {
    viterbi_path.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    viterbi_path.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    viterbi_path.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar3 = sptk::DynamicTimeWarping::Run
                      (&dynamic_time_warping,&query_vectors,&reference_vectors,&viterbi_path,
                       &total_score);
    ppVar11 = viterbi_path.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start;
    if (bVar3) {
      do {
        pcVar9 = local_480;
        if (ppVar11 ==
            viterbi_path.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pcVar12 = local_488;
          if (local_480 == (char *)0x0) goto LAB_00104154;
          std::ofstream::ofstream(&error_message);
          pcVar12 = local_488;
          std::ofstream::open((char *)&error_message,(_Ios_Openmode)pcVar9);
          if ((*(byte *)((long)auStack_218 + *(long *)(_error_message + -0x18)) & 5) != 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp_2);
            poVar8 = std::operator<<((ostream *)&tmp_2,"Cannot open file ");
            std::operator<<(poVar8,pcVar9);
            std::__cxx11::string::string((string *)&local_4a8,"dtw",&local_4b5);
            sptk::PrintErrorMessage(&local_4a8,(ostringstream *)&tmp_2);
LAB_00104122:
            std::__cxx11::string::~string((string *)&local_4a8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp_2);
            iVar10 = 1;
            bVar3 = false;
            goto LAB_0010413f;
          }
          ppVar11 = viterbi_path.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          goto LAB_001040ab;
        }
        bVar3 = sptk::WriteStream<double>
                          (0,iVar6,query_vectors.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + ppVar11->first,
                           (ostream *)&std::cout,(int *)0x0);
        if (!bVar3) break;
        bVar3 = sptk::WriteStream<double>
                          (0,iVar6,reference_vectors.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + ppVar11->second,
                           (ostream *)&std::cout,(int *)0x0);
        ppVar11 = ppVar11 + 1;
      } while (bVar3);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,"Failed to write warped vector");
      std::__cxx11::string::string((string *)&tmp_2,"dtw",(allocator *)&local_4a8);
      sptk::PrintErrorMessage((string *)&tmp_2,&error_message);
      goto LAB_00103fa1;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::operator<<((ostream *)&error_message,"Failed to perform dynamic time warping");
    std::__cxx11::string::string((string *)&tmp_2,"dtw",(allocator *)&local_4a8);
    sptk::PrintErrorMessage((string *)&tmp_2,&error_message);
LAB_00103fa1:
    std::__cxx11::string::~string((string *)&tmp_2);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
    iVar10 = 1;
    goto LAB_00103fbf;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
  std::operator<<((ostream *)&error_message,"Failed to initialize DynamicTimeWarping");
  std::__cxx11::string::string((string *)&tmp_2,"dtw",(allocator *)&local_4a8);
  sptk::PrintErrorMessage((string *)&tmp_2,&error_message);
  std::__cxx11::string::~string((string *)&tmp_2);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
  iVar10 = 1;
LAB_00103fc9:
  sptk::DynamicTimeWarping::~DynamicTimeWarping(&dynamic_time_warping);
LAB_00103fd6:
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&query_vectors);
LAB_00103fe0:
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&reference_vectors);
  return iVar10;
LAB_001040ab:
  if (ppVar11 ==
      viterbi_path.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    bVar3 = true;
LAB_0010413f:
    std::ofstream::~ofstream(&error_message);
    if (bVar3) goto LAB_00104154;
    goto LAB_00103fbf;
  }
  bVar3 = sptk::WriteStream<int>(ppVar11->first,(ostream *)&error_message);
  if (bVar3) goto code_r0x001040c5;
  goto LAB_001040d9;
code_r0x001040c5:
  bVar3 = sptk::WriteStream<int>(ppVar11->second,(ostream *)&error_message);
  ppVar11 = ppVar11 + 1;
  if (!bVar3) {
LAB_001040d9:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp_2);
    std::operator<<((ostream *)&tmp_2,"Failed to write Viterbi path");
    std::__cxx11::string::string((string *)&local_4a8,"dtw",&local_4b5);
    sptk::PrintErrorMessage(&local_4a8,(ostringstream *)&tmp_2);
    goto LAB_00104122;
  }
  goto LAB_001040ab;
LAB_00104154:
  if (pcVar12 != (char *)0x0) {
    std::ofstream::ofstream(&error_message);
    std::ofstream::open((char *)&error_message,(_Ios_Openmode)pcVar12);
    if ((*(byte *)((long)auStack_218 + *(long *)(_error_message + -0x18)) & 5) == 0) {
      bVar5 = sptk::WriteStream<double>(total_score,(ostream *)&error_message);
      bVar3 = true;
      if (!bVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp_2);
        std::operator<<((ostream *)&tmp_2,"Failed to write total score");
        std::__cxx11::string::string((string *)&local_4a8,"dtw",&local_4b5);
        sptk::PrintErrorMessage(&local_4a8,(ostringstream *)&tmp_2);
        goto LAB_0010424e;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp_2);
      poVar8 = std::operator<<((ostream *)&tmp_2,"Cannot open file ");
      std::operator<<(poVar8,pcVar12);
      std::__cxx11::string::string((string *)&local_4a8,"dtw",&local_4b5);
      sptk::PrintErrorMessage(&local_4a8,(ostringstream *)&tmp_2);
LAB_0010424e:
      std::__cxx11::string::~string((string *)&local_4a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp_2);
      iVar10 = 1;
      bVar3 = false;
    }
    std::ofstream::~ofstream(&error_message);
    if (!bVar3) goto LAB_00103fbf;
  }
  iVar10 = 0;
LAB_00103fbf:
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&viterbi_path.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  goto LAB_00103fc9;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  sptk::DynamicTimeWarping::LocalPathConstraints local_path_constraint(
      kDefaultLocalPathConstraint);
  sptk::DistanceCalculation::DistanceMetrics distance_metric(
      kDefaultDistanceMetric);
  const char* total_score_file(NULL);
  const char* viterbi_path_file(NULL);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:p:d:P:S:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("dtw", error_message);
          return 1;
        }
        --num_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("dtw", error_message);
          return 1;
        }
        break;
      }
      case 'p': {
        const int min(0);
        const int max(
            static_cast<int>(
                sptk::DynamicTimeWarping::LocalPathConstraints::kNumTypes) -
            1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -p option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("dtw", error_message);
          return 1;
        }
        local_path_constraint =
            static_cast<sptk::DynamicTimeWarping::LocalPathConstraints>(tmp);
        break;
      }
      case 'd': {
        const int min(0);
        const int max(
            static_cast<int>(
                sptk::DistanceCalculation::DistanceMetrics::kNumMetrics) -
            1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -d option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("dtw", error_message);
          return 1;
        }
        distance_metric =
            static_cast<sptk::DistanceCalculation::DistanceMetrics>(tmp);
        break;
      }
      case 'P': {
        viterbi_path_file = optarg;
        break;
      }
      case 'S': {
        total_score_file = optarg;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const char* reference_file;
  const char* query_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    reference_file = argv[argc - 2];
    query_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    reference_file = argv[argc - 1];
    query_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, file1 and infile, are required";
    sptk::PrintErrorMessage("dtw", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("dtw", error_message);
    return 1;
  }
  const int length(num_order + 1);

  std::vector<std::vector<double> > reference_vectors;
  {
    std::ifstream ifs;
    ifs.open(reference_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << reference_file;
      sptk::PrintErrorMessage("dtw", error_message);
      return 1;
    }
    std::istream& input_stream(ifs);

    std::vector<double> tmp(length);
    while (sptk::ReadStream(false, 0, 0, length, &tmp, &input_stream, NULL)) {
      reference_vectors.push_back(tmp);
    }
  }

  std::vector<std::vector<double> > query_vectors;
  {
    std::ifstream ifs;
    if (NULL != query_file) {
      ifs.open(query_file, std::ios::in | std::ios::binary);
      if (ifs.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << query_file;
        sptk::PrintErrorMessage("dtw", error_message);
        return 1;
      }
    }
    std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

    std::vector<double> tmp(length);
    while (sptk::ReadStream(false, 0, 0, length, &tmp, &input_stream, NULL)) {
      query_vectors.push_back(tmp);
    }
  }

  sptk::DynamicTimeWarping dynamic_time_warping(
      num_order, local_path_constraint, distance_metric);
  if (!dynamic_time_warping.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize DynamicTimeWarping";
    sptk::PrintErrorMessage("dtw", error_message);
    return 1;
  }

  std::vector<std::pair<int, int> > viterbi_path;
  double total_score;
  if (!dynamic_time_warping.Run(query_vectors, reference_vectors, &viterbi_path,
                                &total_score)) {
    std::ostringstream error_message;
    error_message << "Failed to perform dynamic time warping";
    sptk::PrintErrorMessage("dtw", error_message);
    return 1;
  }

  for (std::vector<std::pair<int, int> >::iterator itr(viterbi_path.begin());
       itr != viterbi_path.end(); ++itr) {
    if (!sptk::WriteStream(0, length, query_vectors[itr->first], &std::cout,
                           NULL) ||
        !sptk::WriteStream(0, length, reference_vectors[itr->second],
                           &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write warped vector";
      sptk::PrintErrorMessage("dtw", error_message);
      return 1;
    }
  }

  if (NULL != viterbi_path_file) {
    std::ofstream ofs;
    ofs.open(viterbi_path_file, std::ios::out | std::ios::binary);
    if (ofs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << viterbi_path_file;
      sptk::PrintErrorMessage("dtw", error_message);
      return 1;
    }
    std::ostream& output_stream(ofs);

    for (std::vector<std::pair<int, int> >::iterator itr(viterbi_path.begin());
         itr != viterbi_path.end(); ++itr) {
      if (!sptk::WriteStream(itr->first, &output_stream) ||
          !sptk::WriteStream(itr->second, &output_stream)) {
        std::ostringstream error_message;
        error_message << "Failed to write Viterbi path";
        sptk::PrintErrorMessage("dtw", error_message);
        return 1;
      }
    }
  }

  if (NULL != total_score_file) {
    std::ofstream ofs;
    ofs.open(total_score_file, std::ios::out | std::ios::binary);
    if (ofs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << total_score_file;
      sptk::PrintErrorMessage("dtw", error_message);
      return 1;
    }
    std::ostream& output_stream(ofs);

    if (!sptk::WriteStream(total_score, &output_stream)) {
      std::ostringstream error_message;
      error_message << "Failed to write total score";
      sptk::PrintErrorMessage("dtw", error_message);
      return 1;
    }
  }

  return 0;
}